

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O3

pair<double,_double> __thiscall
manager::Manager<uttt::IBoard>::Match
          (Manager<uttt::IBoard> *this,longlong bot_id1,longlong bot_id2,int count)

{
  IBoard *pIVar1;
  double dVar2;
  undefined1 auVar3 [12];
  short sVar4;
  short sVar5;
  ulong uVar6;
  long *plVar7;
  int iVar8;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false> _Var9;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false> _Var10;
  IBoard *this_00;
  long *plVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined8 uVar16;
  undefined1 auVar15 [16];
  pair<double,_double> pVar17;
  IBot<uttt::IBoard> *bs [2];
  IMove move;
  undefined1 local_98 [32];
  long *local_78 [3];
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false> local_60;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false> local_58;
  IMove local_50;
  Manager<uttt::IBoard> *local_48;
  longlong local_40;
  longlong local_38;
  
  local_48 = this;
  local_40 = bot_id2;
  local_38 = bot_id1;
  _Var9._M_cur = (__node_type *)
                 std::
                 _Hashtable<long_long,_std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->bots)._M_h,&local_38);
  _Var10._M_cur =
       (__node_type *)
       std::
       _Hashtable<long_long,_std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find(&(this->bots)._M_h,&local_40);
  if (count < 1) {
    local_98._0_16_ = ZEXT816(0);
  }
  else {
    uVar13 = 0;
    local_98._0_16_ = ZEXT816(0);
    local_60._M_cur = _Var10._M_cur;
    local_58._M_cur = _Var9._M_cur;
    do {
      this_00 = (IBoard *)operator_new(0x18);
      pIVar1 = local_48->game;
      sVar4 = (pIVar1->micro)._M_elems[0];
      sVar5 = (pIVar1->micro)._M_elems[1];
      uVar16 = *(undefined8 *)((pIVar1->micro)._M_elems + 2);
      this_00->macro = pIVar1->macro;
      (this_00->micro)._M_elems[0] = sVar4;
      (this_00->micro)._M_elems[1] = sVar5;
      *(undefined8 *)((this_00->micro)._M_elems + 2) = uVar16;
      *(undefined8 *)((this_00->micro)._M_elems + 6) = *(undefined8 *)((pIVar1->micro)._M_elems + 6)
      ;
      local_78[0] = (long *)0x0;
      local_78[1] = (long *)0x0;
      plVar11 = (long *)(**(code **)(**(long **)(*(long *)((long)&((_Var9._M_cur)->
                                                                                                                                    
                                                  super__Hash_node_value<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>
                                                  ._M_storage._M_storage + 8) + 8) + 0x10))();
      uVar12 = uVar13 & 1;
      local_78[uVar12] = plVar11;
      plVar11 = (long *)(**(code **)(**(long **)(*(long *)((long)&((_Var10._M_cur)->
                                                                                                                                    
                                                  super__Hash_node_value<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>
                                                  ._M_storage._M_storage + 8) + 8) + 0x10))();
      local_78[uVar12 ^ 1] = plVar11;
      iVar8 = uttt::IBoard::GetStatus(this_00);
      plVar7 = local_78[1];
      plVar11 = local_78[0];
      while (iVar8 == -1) {
        local_50 = (**(code **)(*plVar11 + 0x18))(plVar11);
        uttt::IBoard::ApplyMove(this_00,&local_50);
        (**(code **)(*plVar7 + 0x20))(plVar7,&local_50);
        iVar8 = uttt::IBoard::GetStatus(this_00);
        _Var10._M_cur = local_60._M_cur;
        _Var9._M_cur = local_58._M_cur;
        if (iVar8 != -1) break;
        local_50 = (**(code **)(*plVar7 + 0x18))(plVar7);
        uttt::IBoard::ApplyMove(this_00,&local_50);
        (**(code **)(*plVar11 + 0x20))(plVar11,&local_50);
        iVar8 = uttt::IBoard::GetStatus(this_00);
        _Var10._M_cur = local_60._M_cur;
        _Var9._M_cur = local_58._M_cur;
      }
      if (iVar8 == 1) {
        if (uVar12 != 0) goto LAB_0014a15f;
LAB_0014a147:
        dVar2 = (double)local_98._0_8_ + 1.0;
LAB_0014a154:
        uVar6 = (ulong)local_98._8_8_ >> 0x20;
        local_98._8_4_ = (int)local_98._8_8_;
        local_98._0_8_ = dVar2;
        local_98._12_4_ = (int)uVar6;
      }
      else {
        if (iVar8 == 0) {
          dVar2 = (double)local_98._0_8_ + 0.5;
          local_98._8_8_ = (double)local_98._8_8_ + 0.5;
          goto LAB_0014a154;
        }
        if (uVar12 != 0) goto LAB_0014a147;
LAB_0014a15f:
        local_98._8_8_ = (double)local_98._8_8_ + 1.0;
      }
      if (local_78[0] != (long *)0x0) {
        (**(code **)(*local_78[0] + 8))();
      }
      if (local_78[1] != (long *)0x0) {
        (**(code **)(*local_78[1] + 8))();
      }
      operator_delete(this_00);
      uVar13 = uVar13 + 1;
    } while (uVar13 != count);
  }
  dVar2 = (double)count;
  auVar14._8_4_ = SUB84(dVar2,0);
  auVar14._0_8_ = dVar2;
  auVar14._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar14 = divpd(local_98._0_16_,auVar14);
  uVar16 = 0;
  pVar17 = MM::operator()((MM *)local_78,
                          *(double *)
                           (*(long *)((long)&((_Var9._M_cur)->
                                             super__Hash_node_value<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>
                                             ._M_storage._M_storage + 8) + 0x10),
                          *(double *)
                           (*(long *)((long)&((_Var10._M_cur)->
                                             super__Hash_node_value<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>
                                             ._M_storage._M_storage + 8) + 0x10),auVar14._0_8_);
  *(double *)
   (*(long *)((long)&((_Var9._M_cur)->
                     super__Hash_node_value<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>
                     ._M_storage._M_storage + 8) + 0x10) = pVar17.first;
  *(double *)
   (*(long *)((long)&((_Var10._M_cur)->
                     super__Hash_node_value<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>
                     ._M_storage._M_storage + 8) + 0x10) = pVar17.second;
  auVar3._4_8_ = uVar16;
  auVar3._0_4_ = auVar14._4_4_;
  auVar15._0_8_ = auVar3._0_8_ << 0x20;
  auVar15._8_4_ = auVar14._8_4_;
  auVar15._12_4_ = auVar14._12_4_;
  pVar17.second = auVar15._8_8_;
  pVar17.first = auVar14._0_8_;
  return pVar17;
}

Assistant:

std::pair<double, double>
Manager<IGame>::Match(long long bot_id1, long long bot_id2, int count)
{
    auto it1 = bots.find(bot_id1), it2 = bots.find(bot_id2);

    std::pair<double, double> results;

    for (int i = 0; i < count; ++i)
    {
        auto game_copy = new IGame(*game);
        game::IBot<IGame> *bs[2] = {};
        bs[i % 2] = it1->second->bot->Clone();
        bs[1 - i % 2] = it2->second->bot->Clone();
        int status = game_copy->GetStatus();
        while (status == game::Undecided)
        {
            auto move = bs[0]->MakeMove();
            game_copy->ApplyMove(move);
            bs[1]->SendMove(move);

            status = game_copy->GetStatus();
            if (status != game::Undecided)
                break;

            move = bs[1]->MakeMove();
            game_copy->ApplyMove(move);
            bs[0]->SendMove(move);

            status = game_copy->GetStatus();
        }

        if (status == game::Draw)
            results.first += 0.5, results.second += 0.5;
        else if (status == 1)
            i % 2 == 0 ? results.first += 1.0 : results.second += 1.0;
        else
            i % 2 == 0 ? results.second += 1.0 : results.first += 1.0;

        delete bs[0];
        delete bs[1];
        delete game_copy;
    }

    results.first /= count, results.second /= count;

    auto new_ratings = MM()(it1->second->rating, it2->second->rating, results.first);
    it1->second->rating = new_ratings.first, it2->second->rating = new_ratings.second;

    return results;
}